

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conncache.c
# Opt level: O3

connectdata * Curl_conncache_extract_bundle(Curl_easy *data,connectbundle *bundle)

{
  size_t *psVar1;
  connectdata *pcVar2;
  undefined8 uVar3;
  undefined4 uVar4;
  timediff_t tVar5;
  long lVar6;
  Curl_llist_element *pCVar7;
  connectdata *conn;
  curltime cVar8;
  curltime older;
  curltime newer;
  
  cVar8 = Curl_now();
  pCVar7 = (bundle->conn_list).head;
  if (pCVar7 != (Curl_llist_element *)0x0) {
    lVar6 = -1;
    conn = (connectdata *)0x0;
    do {
      pcVar2 = (connectdata *)pCVar7->ptr;
      if (((pcVar2->easyq).size == 0) &&
         (uVar3 = (pcVar2->lastused).tv_sec, uVar4 = (pcVar2->lastused).tv_usec,
         older.tv_usec = uVar4, older.tv_sec = uVar3, older._12_4_ = 0, newer._12_4_ = 0,
         newer.tv_sec = SUB128(cVar8._0_12_,0), newer.tv_usec = SUB124(cVar8._0_12_,8),
         tVar5 = Curl_timediff(newer,older), lVar6 < tVar5)) {
        lVar6 = tVar5;
        conn = pcVar2;
      }
      pCVar7 = pCVar7->next;
    } while (pCVar7 != (Curl_llist_element *)0x0);
    if (conn != (connectdata *)0x0) {
      bundle_remove_conn(bundle,conn);
      psVar1 = &((data->state).conn_cache)->num_conn;
      *psVar1 = *psVar1 - 1;
      return conn;
    }
  }
  return (connectdata *)0x0;
}

Assistant:

struct connectdata *
Curl_conncache_extract_bundle(struct Curl_easy *data,
                              struct connectbundle *bundle)
{
  struct Curl_llist_element *curr;
  timediff_t highscore = -1;
  timediff_t score;
  struct curltime now;
  struct connectdata *conn_candidate = NULL;
  struct connectdata *conn;

  (void)data;

  now = Curl_now();

  curr = bundle->conn_list.head;
  while(curr) {
    conn = curr->ptr;

    if(!CONN_INUSE(conn)) {
      /* Set higher score for the age passed since the connection was used */
      score = Curl_timediff(now, conn->lastused);

      if(score > highscore) {
        highscore = score;
        conn_candidate = conn;
      }
    }
    curr = curr->next;
  }
  if(conn_candidate) {
    /* remove it to prevent another thread from nicking it */
    bundle_remove_conn(bundle, conn_candidate);
    data->state.conn_cache->num_conn--;
    DEBUGF(infof(data, "The cache now contains %zu members",
                 data->state.conn_cache->num_conn));
  }

  return conn_candidate;
}